

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86DisassemblerDecoder.c
# Opt level: O0

DecodeStatus
decodeInstruction(uint8_t *DecodeTable,MCInst *MI,uint64_t insn,uint64_t Address,MCRegisterInfo *MRI
                 ,int feature)

{
  ushort uVar1;
  _Bool _Var2;
  DecodeStatus DVar3;
  ushort *puVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  _Bool Fail;
  _Bool Pred;
  uint64_t NegativeMask;
  uint64_t PositiveMask;
  uint64_t FieldValue;
  uint64_t Val;
  uint DecodeIdx;
  uint Opc;
  uint PIdx;
  uint NumToSkip;
  uint Len;
  uint Start;
  DecodeStatus S;
  uint32_t ExpectedValue;
  uint32_t CurFieldValue;
  uint8_t *Ptr;
  uint64_t Bits;
  MCRegisterInfo *pMStack_38;
  int feature_local;
  MCRegisterInfo *MRI_local;
  uint64_t Address_local;
  uint64_t insn_local;
  MCInst *MI_local;
  uint8_t *DecodeTable_local;
  
  Bits._4_4_ = feature;
  pMStack_38 = MRI;
  MRI_local = (MCRegisterInfo *)Address;
  Address_local = insn;
  insn_local = (uint64_t)MI;
  MI_local = (MCInst *)DecodeTable;
  Ptr = (uint8_t *)getFeatureBits(feature);
  _ExpectedValue = MI_local;
  S = MCDisassembler_Fail;
  Len = 3;
  do {
    switch((char)_ExpectedValue->OpcodePub) {
    case '\x01':
      NumToSkip = (uint)*(byte *)((long)&_ExpectedValue->OpcodePub + 1);
      PIdx = (uint)*(byte *)((long)&_ExpectedValue->OpcodePub + 2);
      _ExpectedValue = (MCInst *)((long)&_ExpectedValue->OpcodePub + 3);
      uVar5 = fieldFromInstruction(Address_local,NumToSkip,PIdx);
      S = (DecodeStatus)uVar5;
      break;
    case '\x02':
      _ExpectedValue = (MCInst *)((long)&_ExpectedValue->OpcodePub + 1);
      uVar5 = decodeULEB128((uint8_t *)_ExpectedValue,&PIdx);
      puVar4 = (ushort *)((long)_ExpectedValue + (ulong)PIdx);
      _ExpectedValue = (MCInst *)(puVar4 + 1);
      if (uVar5 != S) {
        _ExpectedValue =
             (MCInst *)
             ((long)&((MCInst *)(_ExpectedValue->Operands + -1))->OpcodePub + (ulong)*puVar4);
      }
      break;
    case '\x03':
      NumToSkip = (uint)*(byte *)((long)&_ExpectedValue->OpcodePub + 1);
      PIdx = (uint)*(byte *)((long)&_ExpectedValue->OpcodePub + 2);
      _ExpectedValue = (MCInst *)((long)&_ExpectedValue->OpcodePub + 2);
      uVar5 = fieldFromInstruction(Address_local,NumToSkip,PIdx);
      _ExpectedValue = (MCInst *)((long)_ExpectedValue + 1);
      uVar6 = decodeULEB128((uint8_t *)_ExpectedValue,&PIdx);
      Start = (uint)uVar6;
      puVar4 = (ushort *)((long)_ExpectedValue + (ulong)PIdx);
      _ExpectedValue = (MCInst *)(puVar4 + 1);
      if ((uVar6 & 0xffffffff) != uVar5) {
        _ExpectedValue =
             (MCInst *)
             ((long)&((MCInst *)(_ExpectedValue->Operands + -1))->OpcodePub + (ulong)*puVar4);
      }
      break;
    case '\x04':
      _ExpectedValue = (MCInst *)((long)&_ExpectedValue->OpcodePub + 1);
      uVar5 = decodeULEB128((uint8_t *)_ExpectedValue,&PIdx);
      puVar4 = (ushort *)((long)_ExpectedValue + (ulong)PIdx);
      _ExpectedValue = (MCInst *)(puVar4 + 1);
      uVar1 = *puVar4;
      _Var2 = checkDecoderPredicate((uint)uVar5,(uint64_t)Ptr);
      if (!_Var2) {
        _ExpectedValue =
             (MCInst *)
             ((long)&((MCInst *)(_ExpectedValue->Operands + -1))->OpcodePub + (ulong)uVar1);
      }
      break;
    case '\x05':
      _ExpectedValue = (MCInst *)((long)&_ExpectedValue->OpcodePub + 1);
      uVar5 = decodeULEB128((uint8_t *)_ExpectedValue,&PIdx);
      _ExpectedValue = (MCInst *)((long)_ExpectedValue + (ulong)PIdx);
      uVar6 = decodeULEB128((uint8_t *)_ExpectedValue,&PIdx);
      _ExpectedValue = (MCInst *)((long)_ExpectedValue + (ulong)PIdx);
      MCInst_setOpcode((MCInst *)insn_local,(uint)uVar5);
      DVar3 = decodeToMCInst(Len,(uint)uVar6,Address_local,(MCInst *)insn_local,(uint64_t)MRI_local,
                             pMStack_38);
      return DVar3;
    case '\x06':
      _ExpectedValue = (MCInst *)((long)&_ExpectedValue->OpcodePub + 1);
      uVar5 = decodeULEB128((uint8_t *)_ExpectedValue,&PIdx);
      _ExpectedValue = (MCInst *)((long)_ExpectedValue + (ulong)PIdx);
      uVar6 = decodeULEB128((uint8_t *)_ExpectedValue,&PIdx);
      _ExpectedValue = (MCInst *)((long)_ExpectedValue + (ulong)PIdx);
      if ((Address_local & uVar5) != 0 || ((Address_local ^ 0xffffffffffffffff) & uVar6) != 0) {
        Len = 1;
      }
      break;
    case '\a':
      return MCDisassembler_Fail;
    default:
      return MCDisassembler_Fail;
    }
  } while( true );
}

Assistant:

int decodeInstruction(struct InternalInstruction *insn,
		byteReader_t reader,
		const void *readerArg,
		uint64_t startLoc,
		DisassemblerMode mode)
{
	insn->reader = reader;
	insn->readerArg = readerArg;
	insn->startLocation = startLoc;
	insn->readerCursor = startLoc;
	insn->mode = mode;

	if (readPrefixes(insn)       ||
			readOpcode(insn)         ||
			getID(insn)      ||
			insn->instructionID == 0 ||
			checkPrefix(insn) ||
			readOperands(insn))
		return -1;

	insn->length = (size_t)(insn->readerCursor - insn->startLocation);

	// instruction length must be <= 15 to be valid
	if (insn->length > 15)
		return -1;

	if (insn->operandSize == 0)
		insn->operandSize = insn->registerSize;

	insn->operands = &x86OperandSets[insn->spec->operands][0];

	// dbgprintf(insn, "Read from 0x%llx to 0x%llx: length %zu",
	// 		startLoc, insn->readerCursor, insn->length);

	//if (insn->length > 15)
	//	dbgprintf(insn, "Instruction exceeds 15-byte limit");

#if 0
	printf("\n>>> x86OperandSets = %lu\n", sizeof(x86OperandSets));
	printf(">>> x86DisassemblerInstrSpecifiers = %lu\n", sizeof(x86DisassemblerInstrSpecifiers));
	printf(">>> x86DisassemblerContexts = %lu\n", sizeof(x86DisassemblerContexts));
	printf(">>> modRMTable = %lu\n", sizeof(modRMTable));
	printf(">>> x86DisassemblerOneByteOpcodes = %lu\n", sizeof(x86DisassemblerOneByteOpcodes));
	printf(">>> x86DisassemblerTwoByteOpcodes = %lu\n", sizeof(x86DisassemblerTwoByteOpcodes));
	printf(">>> x86DisassemblerThreeByte38Opcodes = %lu\n", sizeof(x86DisassemblerThreeByte38Opcodes));
	printf(">>> x86DisassemblerThreeByte3AOpcodes = %lu\n", sizeof(x86DisassemblerThreeByte3AOpcodes));
	printf(">>> x86DisassemblerThreeByteA6Opcodes = %lu\n", sizeof(x86DisassemblerThreeByteA6Opcodes));
	printf(">>> x86DisassemblerThreeByteA7Opcodes= %lu\n", sizeof(x86DisassemblerThreeByteA7Opcodes));
	printf(">>> x86DisassemblerXOP8Opcodes = %lu\n", sizeof(x86DisassemblerXOP8Opcodes));
	printf(">>> x86DisassemblerXOP9Opcodes = %lu\n", sizeof(x86DisassemblerXOP9Opcodes));
	printf(">>> x86DisassemblerXOPAOpcodes = %lu\n\n", sizeof(x86DisassemblerXOPAOpcodes));
#endif

	return 0;
}